

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O2

gdImagePtr gdImageCreateFromGd2Ctx(gdIOCtxPtr in)

{
  byte *pbVar1;
  t_chunk_info *ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  gdImagePtr im;
  char *chunkBuf;
  char *compBuf;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  uLongf uVar12;
  long lVar13;
  int fmt;
  int cs;
  int local_90;
  int local_8c;
  int ncy;
  int ncx;
  long local_80;
  gdIOCtxPtr local_78;
  t_chunk_info *chunkIdx;
  t_chunk_info *local_68;
  char *local_60;
  int ch;
  int vers;
  int sy;
  int sx;
  uLongf local_48;
  long local_40;
  uLongf chunkLen;
  
  chunkIdx = (t_chunk_info *)0x0;
  local_78 = in;
  iVar3 = _gd2GetHeader(in,&sx,&sy,&cs,&vers,&fmt,&ncx,&ncy,&chunkIdx);
  if (iVar3 != 0) {
    if (fmt - 3U < 2) {
      im = gdImageCreateTrueColor(sx,sy);
    }
    else {
      im = gdImageCreate(sx,sy);
    }
    if (im != (gdImagePtr)0x0) {
      iVar3 = _gdGetColors(local_78,im,(uint)(vers == 2));
      ptVar2 = chunkIdx;
      if (iVar3 == 0) {
        gdImageDestroy(im);
      }
      else {
        if ((fmt != 2) && (fmt != 4)) {
          chunkBuf = (char *)0x0;
          iVar3 = 0;
          compBuf = (char *)0x0;
LAB_00114dc2:
          local_68 = ptVar2;
          uVar12 = (uLongf)iVar3;
          local_80 = 0;
          uVar7 = 0;
          iVar3 = 0;
          local_60 = compBuf;
          local_48 = uVar12;
          do {
            if (ncy <= iVar3) {
              gdFree(chunkBuf);
              gdFree(compBuf);
              gdFree(local_68);
              return im;
            }
            local_80 = (long)(int)local_80;
            local_90 = iVar3;
            for (iVar4 = 0; iVar4 < ncx; iVar4 = iVar4 + 1) {
              iVar3 = cs * iVar3;
              iVar10 = cs + iVar3;
              if (im->sy <= iVar10) {
                iVar10 = im->sy;
              }
              local_8c = iVar4;
              if ((fmt == 4) || (fmt == 2)) {
                chunkLen = uVar12;
                iVar4 = _gd2ReadChunk(local_68[local_80].offset,compBuf,local_68[local_80].size,
                                      chunkBuf,&chunkLen,local_78);
                uVar7 = 0;
                if (iVar4 == 0) goto LAB_00114fd7;
              }
              lVar11 = (long)iVar10;
              lVar13 = (long)iVar3;
              iVar3 = local_90;
              iVar4 = local_8c;
              local_40 = lVar11;
              for (; lVar13 < lVar11; lVar13 = lVar13 + 1) {
                iVar5 = cs * iVar4;
                iVar10 = cs + iVar5;
                if (im->sx <= cs + iVar5) {
                  iVar10 = im->sx;
                }
                if ((fmt == 4) || (fmt == 2)) {
                  for (lVar6 = (long)iVar5; lVar6 < iVar10; lVar6 = lVar6 + 1) {
                    iVar5 = (int)uVar7;
                    lVar8 = (long)iVar5;
                    uVar7 = lVar8 + 1;
                    if (im->trueColor == 0) {
                      im->pixels[lVar13][lVar6] = chunkBuf[lVar8];
                    }
                    else {
                      pbVar1 = (byte *)(chunkBuf + uVar7);
                      uVar7 = (ulong)(iVar5 + 4);
                      im->tpixels[lVar13][lVar6] =
                           (uint)(byte)chunkBuf[lVar8 + 3] |
                           (uint)(byte)chunkBuf[lVar8 + 2] << 8 |
                           (uint)*pbVar1 << 0x10 | (uint)(byte)chunkBuf[lVar8] << 0x18;
                    }
                  }
                }
                else {
                  lVar6 = (long)iVar5 << 2;
                  for (lVar8 = (long)iVar5; lVar11 = local_40, iVar3 = local_90, iVar4 = local_8c,
                      lVar8 < iVar10; lVar8 = lVar8 + 1) {
                    if (im->trueColor == 0) {
                      iVar3 = gdGetByte(&ch,local_78);
                      if (iVar3 == 0) goto LAB_00114fb2;
                      im->pixels[lVar13][lVar8] = (uchar)ch;
                    }
                    else {
                      iVar3 = gdGetInt((int *)((long)im->tpixels[lVar13] + lVar6),local_78);
                      if (iVar3 == 0) {
LAB_00114fb2:
                        gd_error("gd2: EOF while reading\n");
                        compBuf = local_60;
                        goto LAB_00114fd7;
                      }
                    }
                    lVar6 = lVar6 + 4;
                  }
                }
              }
              local_80 = local_80 + 1;
              uVar12 = local_48;
              compBuf = local_60;
            }
            iVar3 = iVar3 + 1;
          } while( true );
        }
        uVar9 = 0;
        uVar7 = (ulong)(uint)(ncy * ncx);
        if (ncy * ncx < 1) {
          uVar7 = uVar9;
        }
        iVar4 = 0;
        for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
          if (iVar4 < chunkIdx[uVar9].size) {
            iVar4 = chunkIdx[uVar9].size;
          }
        }
        iVar3 = (cs << (im->trueColor != 0) * '\x02') * cs;
        chunkBuf = (char *)gdCalloc((long)iVar3,1);
        if (chunkBuf == (char *)0x0) {
          chunkBuf = (char *)0x0;
        }
        else {
          compBuf = (char *)gdCalloc((ulong)(iVar4 + 1),1);
          if (compBuf != (char *)0x0) goto LAB_00114dc2;
        }
        compBuf = (char *)0x0;
LAB_00114fd7:
        gdImageDestroy(im);
        if (chunkBuf != (char *)0x0) {
          gdFree(chunkBuf);
        }
        if (compBuf != (char *)0x0) {
          gdFree(compBuf);
        }
        if (chunkIdx == (t_chunk_info *)0x0) {
          return (gdImagePtr)0x0;
        }
      }
    }
    gdFree(chunkIdx);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2Ctx (gdIOCtxPtr in)
{
	int sx, sy;
	int i;
	int ncx, ncy, nc, cs, cx, cy;
	int x, y, ylo, yhi, xlo, xhi;
	int vers, fmt;
	t_chunk_info *chunkIdx = NULL;	/* So we can gdFree it with impunity. */
	unsigned char *chunkBuf = NULL;	/* So we can gdFree it with impunity. */
	int chunkNum = 0;
	int chunkMax = 0;
	uLongf chunkLen;
	int chunkPos = 0;
	int compMax = 0;
	int bytesPerPixel;
	char *compBuf = NULL;		/* So we can gdFree it with impunity. */

	gdImagePtr im;

	/* Get the header */
	im =
	    _gd2CreateFromFile (in, &sx, &sy, &cs, &vers, &fmt, &ncx, &ncy,
	                        &chunkIdx);
	if (im == NULL) {
		/* No need to free chunkIdx as _gd2CreateFromFile does it for us. */
		return 0;
	}

	bytesPerPixel = im->trueColor ? 4 : 1;
	nc = ncx * ncy;

	if (gd2_compressed (fmt)) {
		/* Find the maximum compressed chunk size. */
		compMax = 0;
		for (i = 0; (i < nc); i++) {
			if (chunkIdx[i].size > compMax) {
				compMax = chunkIdx[i].size;
			};
		};
		compMax++;

		/* Allocate buffers */
		chunkMax = cs * bytesPerPixel * cs;
		chunkBuf = gdCalloc (chunkMax, 1);
		if (!chunkBuf) {
			goto fail;
		}
		compBuf = gdCalloc (compMax, 1);
		if (!compBuf) {
			goto fail;
		}

		GD2_DBG (printf ("Largest compressed chunk is %d bytes\n", compMax));
	};

	/*      if ( (ncx != sx / cs) || (ncy != sy / cs)) { */
	/*              goto fail2; */
	/*      }; */

	/* Read the data... */
	for (cy = 0; (cy < ncy); cy++) {
		for (cx = 0; (cx < ncx); cx++) {

			ylo = cy * cs;
			yhi = ylo + cs;
			if (yhi > im->sy) {
				yhi = im->sy;
			};

			GD2_DBG (printf
			         ("Processing Chunk %d (%d, %d), y from %d to %d\n",
			          chunkNum, cx, cy, ylo, yhi));

			if (gd2_compressed (fmt)) {

				chunkLen = chunkMax;

				if (!_gd2ReadChunk (chunkIdx[chunkNum].offset,
				                    compBuf,
				                    chunkIdx[chunkNum].size,
				                    (char *) chunkBuf, &chunkLen, in)) {
					GD2_DBG (printf ("Error reading comproessed chunk\n"));
					goto fail;
				};

				chunkPos = 0;
			};

			for (y = ylo; (y < yhi); y++) {

				xlo = cx * cs;
				xhi = xlo + cs;
				if (xhi > im->sx) {
					xhi = im->sx;
				};
				/*GD2_DBG(printf("y=%d: ",y)); */
				if (!gd2_compressed (fmt)) {
					for (x = xlo; x < xhi; x++) {

						if (im->trueColor) {
							if (!gdGetInt (&im->tpixels[y][x], in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
						} else {
							int ch;
							if (!gdGetByte (&ch, in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
							im->pixels[y][x] = ch;
						}
					}
				} else {
					for (x = xlo; x < xhi; x++) {
						if (im->trueColor) {
							/* 2.0.1: work around a gcc bug by being verbose.
							   TBB */
							int a = chunkBuf[chunkPos++] << 24;
							int r = chunkBuf[chunkPos++] << 16;
							int g = chunkBuf[chunkPos++] << 8;
							int b = chunkBuf[chunkPos++];
							/* 2.0.11: tpixels */
							im->tpixels[y][x] = a + r + g + b;
						} else {
							im->pixels[y][x] = chunkBuf[chunkPos++];
						}
					};
				};
				/*GD2_DBG(printf("\n")); */
			};
			chunkNum++;
		};
	};

	GD2_DBG (printf ("Freeing memory\n"));

	gdFree (chunkBuf);
	gdFree (compBuf);
	gdFree (chunkIdx);

	GD2_DBG (printf ("Done\n"));

	return im;

fail:
	gdImageDestroy (im);
	if (chunkBuf) {
		gdFree (chunkBuf);
	}
	if (compBuf) {
		gdFree (compBuf);
	}
	if (chunkIdx) {
		gdFree (chunkIdx);
	}
	return 0;
}